

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::grab_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  reference this_00;
  Point old_end_00;
  Point new_end_00;
  Point PVar8;
  pointer pTVar9;
  reference ppNVar10;
  PositionStackEntry local_140;
  Point local_128;
  Point local_120;
  Point local_118;
  Point local_110;
  undefined1 local_108 [8];
  Change change;
  uint32_t preceding_new_text_size;
  uint32_t preceding_old_text_size;
  uint32_t old_text_size;
  Text *new_text;
  Text *old_text;
  Point new_end;
  Point old_end;
  Point new_start;
  Point old_start;
  PositionStackEntry *left_ancestor_info;
  Node *node;
  Point local_6c;
  PositionStackEntry local_64;
  Point local_40;
  Node *local_38;
  Node *lower_bound;
  Patch *pPStack_28;
  bool inclusive_local;
  Patch *this_local;
  Point end_local;
  Point start_local;
  vector<Patch::Change,_std::allocator<Patch::Change>_> *result;
  
  lower_bound._6_1_ = 0;
  lower_bound._7_1_ = inclusive;
  pPStack_28 = this;
  this_local = (Patch *)end;
  end_local = start;
  std::vector<Patch::Change,_std::allocator<Patch::Change>_>::vector(__return_storage_ptr__);
  if (this->root != (Node *)0x0) {
    local_40 = end_local;
    local_38 = splay_node_starting_before<Patch::OldCoordinates>(this,end_local);
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::clear(&this->node_stack);
    std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::clear
              (&this->left_ancestor_stack);
    Point::Point(&local_6c);
    Point::Point((Point *)((long)&node + 4));
    PositionStackEntry::PositionStackEntry(&local_64,local_6c,stack0xffffffffffffff8c,0,0);
    std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::push_back
              (&this->left_ancestor_stack,&local_64);
    left_ancestor_info = (PositionStackEntry *)this->root;
    if (local_38 == (Node *)0x0) {
      for (; left_ancestor_info->old_end != (Point)0x0;
          left_ancestor_info = *(PositionStackEntry **)&left_ancestor_info->old_end) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (&this->node_stack,(value_type *)&left_ancestor_info);
      }
    }
    while (left_ancestor_info != (PositionStackEntry *)0x0) {
      this_00 = std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
                back(&this->left_ancestor_stack);
      new_start = Point::traverse(&this_00->old_end,&left_ancestor_info[1].new_end);
      old_end = Point::traverse(&this_00->new_end,
                                (Point *)&left_ancestor_info[1].total_old_text_size);
      old_end_00 = Point::traverse(&new_start,(Point *)&left_ancestor_info->total_old_text_size);
      new_end_00 = Point::traverse(&old_end,&left_ancestor_info[1].old_end);
      PVar8 = (Point)std::unique_ptr<Text,_std::default_delete<Text>_>::get
                               ((unique_ptr<Text,_std::default_delete<Text>_> *)
                                (left_ancestor_info + 2));
      pTVar9 = std::unique_ptr<Text,_std::default_delete<Text>_>::get
                         ((unique_ptr<Text,_std::default_delete<Text>_> *)
                          &left_ancestor_info[2].new_end);
      uVar4 = Node::old_text_size((Node *)left_ancestor_info);
      uVar7 = this_00->total_old_text_size;
      uVar5 = Node::left_subtree_old_text_size((Node *)left_ancestor_info);
      iVar6 = uVar7 + uVar5;
      uVar7 = this_00->total_new_text_size;
      uVar5 = Node::left_subtree_new_text_size((Node *)left_ancestor_info);
      change.new_text._4_4_ = uVar7 + uVar5;
      local_108._0_4_ = new_start.row;
      local_108._4_4_ = new_start.column;
      change.old_end = old_end;
      change.old_start = old_end_00;
      change.new_start = new_end_00;
      change.new_end = PVar8;
      change.old_text = pTVar9;
      change.new_text._0_4_ = iVar6;
      change.preceding_old_text_size = uVar4;
      change._60_4_ = change.new_text._4_4_;
      if ((lower_bound._7_1_ & 1) == 0) {
        local_120 = OldCoordinates::start((Change *)local_108);
        bVar2 = Point::operator>=(&local_120,(Point *)&this_local);
        if (bVar2) {
          return __return_storage_ptr__;
        }
        local_128 = OldCoordinates::end((Change *)local_108);
        bVar2 = Point::operator>(&local_128,&end_local);
        if (bVar2) {
          std::vector<Patch::Change,_std::allocator<Patch::Change>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_108);
        }
      }
      else {
        local_110 = OldCoordinates::start((Change *)local_108);
        bVar2 = Point::operator>(&local_110,(Point *)&this_local);
        if (bVar2) {
          return __return_storage_ptr__;
        }
        local_118 = OldCoordinates::end((Change *)local_108);
        bVar2 = Point::operator>=(&local_118,&end_local);
        if (bVar2) {
          std::vector<Patch::Change,_std::allocator<Patch::Change>_>::push_back
                    (__return_storage_ptr__,(value_type *)local_108);
        }
      }
      if (left_ancestor_info->new_end == (Point)0x0) {
        while( true ) {
          bVar3 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty
                            (&this->node_stack);
          bVar2 = false;
          if (!bVar3) {
            ppNVar10 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                                 (&this->node_stack);
            bVar2 = (*ppNVar10)->right == (Node *)left_ancestor_info;
          }
          if (!bVar2) break;
          ppNVar10 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                               (&this->node_stack);
          left_ancestor_info = (PositionStackEntry *)*ppNVar10;
          std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back(&this->node_stack);
          std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
          pop_back(&this->left_ancestor_stack);
        }
        bVar2 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty(&this->node_stack)
        ;
        if (bVar2) {
          left_ancestor_info = (PositionStackEntry *)0x0;
        }
        else {
          ppNVar10 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                               (&this->node_stack);
          left_ancestor_info = (PositionStackEntry *)*ppNVar10;
          std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back(&this->node_stack);
        }
      }
      else {
        uVar7 = Node::old_text_size((Node *)left_ancestor_info);
        uVar1 = change._60_4_;
        uVar4 = Node::new_text_size((Node *)left_ancestor_info);
        PositionStackEntry::PositionStackEntry
                  (&local_140,old_end_00,new_end_00,iVar6 + uVar7,uVar1 + uVar4);
        std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
        push_back(&this->left_ancestor_stack,&local_140);
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (&this->node_stack,(value_type *)&left_ancestor_info);
        for (left_ancestor_info = *(PositionStackEntry **)&left_ancestor_info->new_end;
            left_ancestor_info->old_end != (Point)0x0;
            left_ancestor_info = *(PositionStackEntry **)&left_ancestor_info->old_end) {
          std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                    (&this->node_stack,(value_type *)&left_ancestor_info);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Change> Patch::grab_changes_in_range(Point start, Point end, bool inclusive) {
  vector<Change> result;
  if (!root)
    return result;

  Node *lower_bound = splay_node_starting_before<CoordinateSpace>(start);

  node_stack.clear();
  left_ancestor_stack.clear();
  left_ancestor_stack.push_back({Point(), Point(), 0, 0});

  Node *node = root;
  if (!lower_bound) {
    while (node->left) {
      node_stack.push_back(node);
      node = node->left;
    }
  }

  while (node) {
    Patch::PositionStackEntry &left_ancestor_info =
        left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };

    if (inclusive) {
      if (CoordinateSpace::start(change) > end) {
        break;
      }

      if (CoordinateSpace::end(change) >= start) {
        result.push_back(change);
      }
    } else {
      if (CoordinateSpace::start(change) >= end) {
        break;
      }

      if (CoordinateSpace::end(change) > start) {
        result.push_back(change);
      }
    }

    if (node->right) {
      left_ancestor_stack.push_back(Patch::PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}